

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexttable.cpp
# Opt level: O2

void __thiscall QTextTable::insertRows(QTextTable *this,int pos,int num)

{
  QTextFormatCollection *this_00;
  uint uVar1;
  QTextTablePrivate *this_01;
  QTextDocumentPrivate *this_02;
  int iVar2;
  int iVar3;
  int blockFormat;
  uint *puVar4;
  uint uVar5;
  int i;
  int iVar6;
  long lVar7;
  int iVar8;
  long in_FS_OFFSET;
  uint local_ac;
  QTextFormat local_68;
  undefined1 local_58 [24];
  uint local_40;
  undefined4 uStack_3c;
  int *local_38;
  
  local_38 = *(int **)(in_FS_OFFSET + 0x28);
  if (num < 1) goto LAB_004af2ee;
  this_01 = *(QTextTablePrivate **)&(this->super_QTextFrame).super_QTextObject.field_0x8;
  if (this_01->dirty == true) {
    QTextTablePrivate::update(this_01);
  }
  iVar2 = this_01->nRows;
  iVar3 = pos;
  if (iVar2 < pos) {
    iVar3 = iVar2;
  }
  if (pos < 0) {
    iVar3 = iVar2;
  }
  this_02 = (this_01->super_QTextFramePrivate).super_QTextObjectPrivate.pieceTable;
  this_00 = &this_02->formats;
  QTextDocumentPrivate::beginEditBlock(this_02);
  if (iVar3 < 1) {
    if (iVar3 != 0) goto LAB_004af1c9;
    puVar4 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](&this_01->grid,0);
LAB_004af1e6:
    local_ac = *puVar4;
    iVar2 = this_01->nCols;
    iVar8 = 0;
  }
  else {
    if (this_01->nRows <= iVar3) {
LAB_004af1c9:
      puVar4 = &(this_01->super_QTextFramePrivate).fragment_end;
      goto LAB_004af1e6;
    }
    lVar7 = 0;
    local_ac = 0;
    iVar8 = 0;
    uVar5 = 0xffffffff;
    while( true ) {
      iVar2 = this_01->nCols;
      if (iVar2 <= (int)lVar7) break;
      puVar4 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 (&this_01->grid,(long)(iVar2 * iVar3 + (int)lVar7));
      uVar1 = *puVar4;
      puVar4 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 (&this_01->grid,(long)this_01->nCols * ((long)iVar3 + -1) + lVar7);
      if (uVar1 == *puVar4) {
        if (uVar1 != uVar5) {
          _local_40 = (Data *)CONCAT44(0xaaaaaaaa,uVar1);
          local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_58._16_8_ = &this_02->fragments;
          QTextFormatCollection::charFormat((QTextFormatCollection *)local_58,(int)this_00);
          iVar2 = QTextCharFormat::tableCellRowSpan((QTextCharFormat *)local_58);
          QTextCharFormat::setTableCellRowSpan((QTextCharFormat *)local_58,iVar2 + num);
          iVar2 = QFragmentMap<QTextFragmentData>::ConstIterator::position
                            ((ConstIterator *)(local_58 + 0x10));
          QTextDocumentPrivate::setCharFormat(this_02,iVar2,1,(QTextCharFormat *)local_58,SetFormat)
          ;
          QTextFormat::~QTextFormat((QTextFormat *)local_58);
        }
        iVar8 = iVar8 + 1;
      }
      else if (local_ac == 0) {
        local_ac = uVar1;
      }
      lVar7 = lVar7 + 1;
      uVar5 = uVar1;
    }
  }
  if (iVar8 < iVar2) {
    local_58._16_8_ = &this_02->fragments;
    _local_40 = (Data *)CONCAT44(0xaaaaaaaa,local_ac);
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextFormatCollection::charFormat((QTextFormatCollection *)local_58,(int)this_00);
    QTextCharFormat::setTableCellRowSpan((QTextCharFormat *)local_58,1);
    QTextCharFormat::setTableCellColumnSpan((QTextCharFormat *)local_58,1);
    iVar2 = QFragmentMap<QTextFragmentData>::ConstIterator::position
                      ((ConstIterator *)(local_58 + 0x10));
    iVar3 = QTextFormatCollection::indexForFormat(this_00,(QTextFormat *)local_58);
    QTextBlockFormat::QTextBlockFormat((QTextBlockFormat *)&local_68);
    blockFormat = QTextFormatCollection::indexForFormat(this_00,&local_68);
    QTextFormat::~QTextFormat(&local_68);
    for (iVar6 = 0; iVar6 < (this_01->nCols - iVar8) * num; iVar6 = iVar6 + 1) {
      QTextDocumentPrivate::insertBlock(this_02,(QChar)0xfdd0,iVar2,blockFormat,iVar3,MoveCursor);
    }
    QTextFormat::~QTextFormat((QTextFormat *)local_58);
  }
  QTextDocumentPrivate::endEditBlock(this_02);
LAB_004af2ee:
  if (*(int **)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextTable::insertRows(int pos, int num)
{
    Q_D(QTextTable);
    if (num <= 0)
        return;

    if (d->dirty)
        d->update();

    if (pos > d->nRows || pos < 0)
        pos = d->nRows;

//     qDebug() << "-------- insertRows" << pos << num;
    QTextDocumentPrivate *p = d->pieceTable;
    QTextFormatCollection *c = p->formatCollection();
    p->beginEditBlock();

    int extended = 0;
    int insert_before = 0;
    if (pos > 0 && pos < d->nRows) {
        int lastCell = -1;
        for (int i = 0; i < d->nCols; ++i) {
            int cell = d->grid[pos*d->nCols + i];
            if (cell == d->grid[(pos-1)*d->nCols+i]) {
                // cell spans the insertion place, extend it
                if (cell != lastCell) {
                    QTextDocumentPrivate::FragmentIterator it(&p->fragmentMap(), cell);
                    QTextCharFormat fmt = c->charFormat(it->format);
                    fmt.setTableCellRowSpan(fmt.tableCellRowSpan() + num);
                    p->setCharFormat(it.position(), 1, fmt);
                }
                extended++;
            } else if (!insert_before) {
                insert_before = cell;
            }
            lastCell = cell;
        }
    } else {
        insert_before = (pos == 0 ? d->grid[0] : d->fragment_end);
    }
    if (extended < d->nCols) {
        Q_ASSERT(insert_before);
        QTextDocumentPrivate::FragmentIterator it(&p->fragmentMap(), insert_before);
        QTextCharFormat fmt = c->charFormat(it->format);
        fmt.setTableCellRowSpan(1);
        fmt.setTableCellColumnSpan(1);
        Q_ASSERT(fmt.objectIndex() == objectIndex());
        int pos = it.position();
        int cfmt = p->formatCollection()->indexForFormat(fmt);
        int bfmt = p->formatCollection()->indexForFormat(QTextBlockFormat());
//         qDebug("inserting %d cells, nCols=%d extended=%d", num*(d->nCols-extended), d->nCols, extended);
        for (int i = 0; i < num*(d->nCols-extended); ++i)
            p->insertBlock(QTextBeginningOfFrame, pos, bfmt, cfmt, QTextUndoCommand::MoveCursor);
    }

//     qDebug() << "-------- end insertRows" << pos << num;
    p->endEditBlock();
}